

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# load.c
# Opt level: O1

wchar_t rd_messages(void)

{
  int iVar1;
  int16_t num;
  uint16_t tmp16u;
  char buf [128];
  short local_9c;
  uint16_t local_9a;
  char local_98 [128];
  
  rd_s16b(&local_9c);
  if (0 < local_9c) {
    iVar1 = 0;
    do {
      rd_string(local_98,0x80);
      rd_u16b(&local_9a);
      message_add(local_98,local_9a);
      iVar1 = iVar1 + 1;
    } while (iVar1 < local_9c);
  }
  return L'\0';
}

Assistant:

int rd_messages(void)
{
	int i;
	char buf[128];
	uint16_t tmp16u;

	int16_t num;

	/* Total */
	rd_s16b(&num);

	/* Read the messages */
	for (i = 0; i < num; i++) {
		/* Read the message */
		rd_string(buf, sizeof(buf));

		/* Read the message type */
		rd_u16b(&tmp16u);

		/* Save the message */
		message_add(buf, tmp16u);
	}

	return 0;
}